

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
* __thiscall
libtorrent::dht::dht_tracker::live_nodes
          (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           *__return_storage_ptr__,dht_tracker *this,node_id *nid)

{
  uint uVar1;
  _Rb_tree_color _Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_header *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Any_data local_58;
  undefined1 local_48 [16];
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var4 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var4;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    auVar5[0] = -(*(char *)&p_Var3[4]._M_left == (char)(nid->m_number)._M_elems[0]);
    auVar5[1] = -(*(char *)((long)&p_Var3[4]._M_left + 1) ==
                 *(char *)((long)(nid->m_number)._M_elems + 1));
    auVar5[2] = -(*(char *)((long)&p_Var3[4]._M_left + 2) ==
                 *(char *)((long)(nid->m_number)._M_elems + 2));
    auVar5[3] = -(*(char *)((long)&p_Var3[4]._M_left + 3) ==
                 *(char *)((long)(nid->m_number)._M_elems + 3));
    auVar5[4] = -(*(char *)((long)&p_Var3[4]._M_left + 4) == (char)(nid->m_number)._M_elems[1]);
    auVar5[5] = -(*(char *)((long)&p_Var3[4]._M_left + 5) ==
                 *(char *)((long)(nid->m_number)._M_elems + 5));
    auVar5[6] = -(*(char *)((long)&p_Var3[4]._M_left + 6) ==
                 *(char *)((long)(nid->m_number)._M_elems + 6));
    auVar5[7] = -(*(char *)((long)&p_Var3[4]._M_left + 7) ==
                 *(char *)((long)(nid->m_number)._M_elems + 7));
    auVar5[8] = -(*(char *)&p_Var3[4]._M_right == (char)(nid->m_number)._M_elems[2]);
    auVar5[9] = -(*(char *)((long)&p_Var3[4]._M_right + 1) ==
                 *(char *)((long)(nid->m_number)._M_elems + 9));
    auVar5[10] = -(*(char *)((long)&p_Var3[4]._M_right + 2) ==
                  *(char *)((long)(nid->m_number)._M_elems + 10));
    auVar5[0xb] = -(*(char *)((long)&p_Var3[4]._M_right + 3) ==
                   *(char *)((long)(nid->m_number)._M_elems + 0xb));
    auVar5[0xc] = -(*(char *)((long)&p_Var3[4]._M_right + 4) == (char)(nid->m_number)._M_elems[3]);
    auVar5[0xd] = -(*(char *)((long)&p_Var3[4]._M_right + 5) ==
                   *(char *)((long)(nid->m_number)._M_elems + 0xd));
    auVar5[0xe] = -(*(char *)((long)&p_Var3[4]._M_right + 6) ==
                   *(char *)((long)(nid->m_number)._M_elems + 0xe));
    auVar5[0xf] = -(*(char *)((long)&p_Var3[4]._M_right + 7) ==
                   *(char *)((long)(nid->m_number)._M_elems + 0xf));
    uVar1 = (nid->m_number)._M_elems[4];
    _Var2 = p_Var3[5]._M_color;
    auVar6[0] = -((char)_Var2 == (char)uVar1);
    auVar6[1] = -((char)(_Var2 >> 8) == (char)(uVar1 >> 8));
    auVar6[2] = -((char)(_Var2 >> 0x10) == (char)(uVar1 >> 0x10));
    auVar6[3] = -((char)(_Var2 >> 0x18) == (char)(uVar1 >> 0x18));
    auVar6[4] = 0xff;
    auVar6[5] = 0xff;
    auVar6[6] = 0xff;
    auVar6[7] = 0xff;
    auVar6[8] = 0xff;
    auVar6[9] = 0xff;
    auVar6[10] = 0xff;
    auVar6[0xb] = 0xff;
    auVar6[0xc] = 0xff;
    auVar6[0xd] = 0xff;
    auVar6[0xe] = 0xff;
    auVar6[0xf] = 0xff;
    auVar6 = auVar6 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) break;
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    local_38._8_8_ = 0;
    local_38._M_unused._M_object = __return_storage_ptr__;
    pcStack_20 = std::
                 _Function_handler<void_(const_libtorrent::dht::node_entry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/kademlia/dht_tracker.cpp:583:40)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_libtorrent::dht::node_entry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/kademlia/dht_tracker.cpp:583:40)>
               ::_M_manager;
    local_58 = (_Any_data)0x0;
    local_48 = (undefined1  [16])0x0;
    routing_table::for_each_node
              ((routing_table *)&p_Var3[5]._M_parent,
               (function<void_(const_libtorrent::dht::node_entry_&)> *)&local_38,
               (function<void_(const_libtorrent::dht::node_entry_&)> *)&local_58);
    if ((code *)local_48._0_8_ != (code *)0x0) {
      (*(code *)local_48._0_8_)(&local_58,&local_58,__destroy_functor);
    }
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<node_id, udp::endpoint>> dht_tracker::live_nodes(node_id const& nid)
	{
		std::vector<std::pair<node_id, udp::endpoint>> ret;

		auto n = std::find_if(m_nodes.begin(), m_nodes.end()
			, [&](tracker_nodes_t::value_type const& v) { return v.second.dht.nid() == nid; });

		if (n != m_nodes.end())
		{
			n->second.dht.m_table.for_each_node([&ret](node_entry const& e)
				{ ret.emplace_back(e.id, e.endpoint); }, nullptr);
		}

		return ret;
	}